

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser.cpp
# Opt level: O1

bool __thiscall QHttpHeaderParser::parseStatus(QHttpHeaderParser *this,QByteArrayView status)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  void *pvVar6;
  uint uVar7;
  storage_type *psVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  char *b;
  long in_FS_OFFSET;
  bool bVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  psVar8 = status.m_data;
  uVar9 = status.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (10 < (long)uVar9) {
    QVar16.m_data = "HTTP/";
    QVar16.m_size = 5;
    cVar5 = QtPrivate::startsWith(status,QVar16);
    if ((cVar5 != '\0') && (psVar8[6] == '.')) {
      uVar11 = 0;
      if (psVar8[8] != ' ') goto LAB_00195e79;
      this->majorVersion = psVar8[5] + -0x30;
      this->minorVersion = psVar8[7] + -0x30;
      pvVar6 = memchr(psVar8 + 9,0x20,uVar9 - 9);
      uVar12 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)psVar8;
      uVar10 = uVar9;
      if (8 < (long)uVar12) {
        uVar10 = uVar12;
      }
      QVar14.m_data = (storage_type *)(uVar10 - 9);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QVar14.m_size = (qsizetype)&local_58;
      QtPrivate::toSignedInteger(QVar14,(int)(psVar8 + 9));
      bVar13 = ((ulong)pcStack_50 & 1) != 0;
      bVar4 = (ulong)(local_58 + 0x8000000) >> 0x20 != 0;
      uVar7 = (uint)local_58;
      if (bVar4 || bVar13) {
        uVar7 = uVar11;
      }
      this->statusCode = uVar7;
      if ((long)uVar12 < 9) {
        local_58 = (QArrayData *)0x0;
        pcStack_50 = (char16_t *)0x0;
        local_48 = (undefined1 *)0x0;
      }
      else {
        QVar15.m_data = (storage_type *)(uVar9 - (uVar12 + 1));
        QVar15.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar15);
      }
      pQVar1 = &((this->reasonPhrase).d.d)->super_QArrayData;
      pcVar2 = (this->reasonPhrase).d.ptr;
      (this->reasonPhrase).d.d = (Data *)local_58;
      (this->reasonPhrase).d.ptr = pcStack_50;
      qVar3 = (this->reasonPhrase).d.size;
      (this->reasonPhrase).d.size = (qsizetype)local_48;
      local_58 = pQVar1;
      pcStack_50 = pcVar2;
      local_48 = (undefined1 *)qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if ((!bVar4 && !bVar13) && (uint)this->majorVersion < 10) {
        uVar11 = (uint)((uint)this->minorVersion < 10);
        goto LAB_00195e79;
      }
    }
  }
  uVar11 = 0;
LAB_00195e79:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB41(uVar11,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaderParser::parseStatus(QByteArrayView status)
{
    // from RFC 2616:
    //        Status-Line = HTTP-Version SP Status-Code SP Reason-Phrase CRLF
    //        HTTP-Version   = "HTTP" "/" 1*DIGIT "." 1*DIGIT
    // that makes: 'HTTP/n.n xxx Message'
    // byte count:  0123456789012

    static const int minLength = 11;
    static const int dotPos = 6;
    static const int spacePos = 8;
    static const char httpMagic[] = "HTTP/";

    if (status.size() < minLength
        || !status.startsWith(httpMagic)
        || status.at(dotPos) != '.'
        || status.at(spacePos) != ' ') {
        // I don't know how to parse this status line
        return false;
    }

    // optimize for the valid case: defer checking until the end
    majorVersion = status.at(dotPos - 1) - '0';
    minorVersion = status.at(dotPos + 1) - '0';

    int i = spacePos;
    qsizetype j = status.indexOf(' ', i + 1);
    const QByteArrayView code = j > i ? status.sliced(i + 1, j - i - 1)
                                      : status.sliced(i + 1);

    bool ok = false;
    statusCode = code.toInt(&ok);

    reasonPhrase = j > i ? QString::fromLatin1(status.sliced(j + 1))
                         : QString();

    return ok && uint(majorVersion) <= 9 && uint(minorVersion) <= 9;
}